

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headergen.c
# Opt level: O0

void printdelem(rnndelem *elem,uint64_t offset)

{
  FILE *pFVar1;
  long lVar2;
  int local_30;
  uint local_2c;
  int j;
  int i;
  FILE *dst;
  int total;
  int len;
  uint64_t offset_local;
  rnndelem *elem_local;
  
  if ((elem->varinfo).dead == 0) {
    _total = offset;
    offset_local = (uint64_t)elem;
    if (elem->length != 1) {
      if (stridesmax <= stridesnum) {
        if (stridesmax == 0) {
          stridesmax = 0x10;
        }
        else {
          stridesmax = stridesmax << 1;
        }
        strides = (uint64_t *)realloc(strides,(long)stridesmax << 3);
      }
      lVar2 = (long)stridesnum;
      stridesnum = stridesnum + 1;
      strides[lVar2] = *(uint64_t *)(offset_local + 0x28);
    }
    if (*(long *)(offset_local + 8) != 0) {
      if (stridesnum == 0) {
        printdef(*(char **)(offset_local + 0x100),(char *)0x0,0,
                 _total + *(long *)(offset_local + 0x18),*(char **)(offset_local + 0x108));
      }
      else {
        pFVar1 = (FILE *)findfout(*(char **)(offset_local + 0x108));
        fprintf(pFVar1,"#define %s(%n",*(undefined8 *)(offset_local + 0x100),&dst);
        for (local_2c = 0; (int)local_2c < stridesnum; local_2c = local_2c + 1) {
          if (local_2c != 0) {
            fprintf(pFVar1,", ");
            dst._0_4_ = (int)dst + 2;
          }
          fprintf(pFVar1,"i%d%n",(ulong)local_2c,(long)&dst + 4);
          dst._0_4_ = dst._4_4_ + (int)dst;
        }
        fprintf(pFVar1,")");
        dst._0_4_ = (int)dst + 1;
        seekcol((FILE *)pFVar1,(int)dst,startcol + -1);
        fprintf(pFVar1,"(0x%08lx",_total + *(long *)(offset_local + 0x18));
        for (local_2c = 0; (int)local_2c < stridesnum; local_2c = local_2c + 1) {
          fprintf(pFVar1," + %#lx*(i%d)",strides[(int)local_2c],(ulong)local_2c);
        }
        fprintf(pFVar1,")\n");
      }
      if (*(long *)(offset_local + 0x28) != 0) {
        printdef(*(char **)(offset_local + 0x100),"ESIZE",0,*(uint64_t *)(offset_local + 0x28),
                 *(char **)(offset_local + 0x108));
      }
      if (*(long *)(offset_local + 0x20) != 1) {
        printdef(*(char **)(offset_local + 0x100),"LEN",0,*(uint64_t *)(offset_local + 0x20),
                 *(char **)(offset_local + 0x108));
      }
      printtypeinfo((rnntypeinfo *)(offset_local + 0x80),*(char **)(offset_local + 0x100),0,
                    *(char **)(offset_local + 0x108));
    }
    pFVar1 = (FILE *)findfout(*(char **)(offset_local + 0x108));
    fprintf(pFVar1,"\n");
    for (local_30 = 0; local_30 < *(int *)(offset_local + 0x38); local_30 = local_30 + 1) {
      printdelem(*(rnndelem **)(*(long *)(offset_local + 0x30) + (long)local_30 * 8),
                 _total + *(long *)(offset_local + 0x18));
    }
    if (*(long *)(offset_local + 0x20) != 1) {
      stridesnum = stridesnum + -1;
    }
  }
  return;
}

Assistant:

void printdelem (struct rnndelem *elem, uint64_t offset) {
	if (elem->varinfo.dead)
		return;
	if (elem->length != 1)
		ADDARRAY(strides, elem->stride);
	if (elem->name) {
		if (stridesnum) {
			int len, total;
			FILE *dst = findfout(elem->file);
			fprintf (dst, "#define %s(%n", elem->fullname, &total);
			int i;
			for (i = 0; i < stridesnum; i++) {
				if (i) {
					fprintf(dst, ", ");
					total += 2;
				}
				fprintf (dst, "i%d%n", i, &len);
				total += len;
			}
			fprintf (dst, ")");
			total++;
			seekcol (dst, total, startcol-1);
			fprintf (dst, "(0x%08"PRIx64"", offset + elem->offset);
			for (i = 0; i < stridesnum; i++)
				fprintf (dst, " + %#" PRIx64 "*(i%d)", strides[i], i);
			fprintf (dst, ")\n");
		} else
			printdef (elem->fullname, 0, 0, offset + elem->offset, elem->file);
		if (elem->stride)
			printdef (elem->fullname, "ESIZE", 0, elem->stride, elem->file);
		if (elem->length != 1)
			printdef (elem->fullname, "LEN", 0, elem->length, elem->file);
		printtypeinfo (&elem->typeinfo, elem->fullname, 0, elem->file);
	}
	fprintf (findfout(elem->file), "\n");
	int j;
	for (j = 0; j < elem->subelemsnum; j++) {
		printdelem(elem->subelems[j], offset + elem->offset);
	}
	if (elem->length != 1) stridesnum--;
}